

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O0

bool duckdb::TryDecimalStringCast<duckdb::hugeint_t,(char)44>
               (char *string_ptr,idx_t string_size,hugeint_t *result,uint8_t width,uint8_t scale)

{
  bool bVar1;
  byte in_CL;
  undefined8 *in_RDX;
  int64_t extraout_RDX;
  hugeint_t in;
  DecimalCastData<duckdb::hugeint_t> state;
  DecimalCastData<duckdb::hugeint_t> *in_stack_ffffffffffffff78;
  duckdb *this;
  int64_t in_stack_ffffffffffffff88;
  char *buf;
  hugeint_t *in_stack_ffffffffffffff90;
  undefined8 local_60;
  undefined8 local_58;
  
  hugeint_t::hugeint_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  this = *(duckdb **)(Hugeint::POWERS_OF_TEN + (ulong)in_CL * 0x10);
  buf = *(char **)(Hugeint::POWERS_OF_TEN + (ulong)in_CL * 0x10 + 8);
  in.upper = extraout_RDX;
  in.lower = (uint64_t)buf;
  UnsafeNumericCast<duckdb::hugeint_t,duckdb::hugeint_t,void>(this,in);
  bVar1 = TryIntegerCast<duckdb::DecimalCastData<duckdb::hugeint_t>,true,true,duckdb::DecimalCastOperation,false,(char)44>
                    (buf,(idx_t)this,in_stack_ffffffffffffff78,false);
  if (bVar1) {
    *in_RDX = local_60;
    in_RDX[1] = local_58;
  }
  return bVar1;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		return false;
	}
	result = state.result;
	return true;
}